

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflection_IsDescendantOneof_Test::TestBody
          (GeneratedMessageReflection_IsDescendantOneof_Test *this)

{
  bool bVar1;
  TestAllTypes *pTVar2;
  TestAllTypes_NestedMessage *pTVar3;
  char *pcVar4;
  ForeignMessage *pFVar5;
  char *in_R9;
  string local_180;
  AssertHelper local_160;
  Message local_158;
  bool local_149;
  undefined1 local_148 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_118;
  Message local_110;
  bool local_101;
  undefined1 local_100 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_d0;
  Message local_c8;
  bool local_b9;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_88;
  Message local_80;
  bool local_71;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  undefined1 local_50 [8];
  TestOneof msg2;
  TestOneof msg1;
  GeneratedMessageReflection_IsDescendantOneof_Test *this_local;
  
  proto2_unittest::TestOneof::TestOneof((TestOneof *)&msg2.field_0._impl_._cached_size_);
  proto2_unittest::TestOneof::TestOneof((TestOneof *)local_50);
  pTVar2 = proto2_unittest::TestOneof::mutable_foo_message
                     ((TestOneof *)&msg2.field_0._impl_._cached_size_);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(pTVar2);
  proto2_unittest::TestOneof::operator=
            ((TestOneof *)local_50,(TestOneof *)&msg2.field_0._impl_._cached_size_);
  pTVar2 = proto2_unittest::TestOneof::foo_message((TestOneof *)&msg2.field_0._impl_._cached_size_);
  pTVar3 = proto2_unittest::TestAllTypes::optional_nested_message(pTVar2);
  local_71 = internal::IsDescendant
                       ((Message *)&msg2.field_0._impl_._cached_size_,&pTVar3->super_Message);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_70,&local_71,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_70,
               (AssertionResult *)"IsDescendant(msg1, msg1.foo_message().optional_nested_message())"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x6d6,pcVar4);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  pTVar2 = proto2_unittest::TestOneof::foo_message((TestOneof *)&msg2.field_0._impl_._cached_size_);
  pFVar5 = proto2_unittest::TestAllTypes::repeated_foreign_message(pTVar2,0);
  local_b9 = internal::IsDescendant
                       ((Message *)&msg2.field_0._impl_._cached_size_,&pFVar5->super_Message);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b8,&local_b9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_b8,
               (AssertionResult *)
               "IsDescendant(msg1, msg1.foo_message().repeated_foreign_message(0))","false","true",
               in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x6d8,pcVar4);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  pTVar2 = proto2_unittest::TestOneof::foo_message((TestOneof *)local_50);
  pTVar3 = proto2_unittest::TestAllTypes::optional_nested_message(pTVar2);
  bVar1 = internal::IsDescendant
                    ((Message *)&msg2.field_0._impl_._cached_size_,&pTVar3->super_Message);
  local_101 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_100,&local_101,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_100,
               (AssertionResult *)"IsDescendant(msg1, msg2.foo_message().optional_nested_message())"
               ,"true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x6db,pcVar4);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  pTVar2 = proto2_unittest::TestOneof::foo_message((TestOneof *)local_50);
  pFVar5 = proto2_unittest::TestAllTypes::repeated_foreign_message(pTVar2,0);
  bVar1 = internal::IsDescendant
                    ((Message *)&msg2.field_0._impl_._cached_size_,&pFVar5->super_Message);
  local_149 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_148,&local_149,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_180,(internal *)local_148,
               (AssertionResult *)
               "IsDescendant(msg1, msg2.foo_message().repeated_foreign_message(0))","true","false",
               in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x6dd,pcVar4);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  proto2_unittest::TestOneof::~TestOneof((TestOneof *)local_50);
  proto2_unittest::TestOneof::~TestOneof((TestOneof *)&msg2.field_0._impl_._cached_size_);
  return;
}

Assistant:

TEST(GeneratedMessageReflection, IsDescendantOneof) {
  unittest::TestOneof msg1, msg2;
  TestUtil::SetAllFields(msg1.mutable_foo_message());
  msg2 = msg1;

  EXPECT_TRUE(IsDescendant(msg1, msg1.foo_message().optional_nested_message()));
  EXPECT_TRUE(
      IsDescendant(msg1, msg1.foo_message().repeated_foreign_message(0)));

  EXPECT_FALSE(
      IsDescendant(msg1, msg2.foo_message().optional_nested_message()));
  EXPECT_FALSE(
      IsDescendant(msg1, msg2.foo_message().repeated_foreign_message(0)));
}